

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

CURLcode ossl_connect_common(Curl_cfilter *cf,Curl_easy *data,_Bool nonblocking,_Bool *done)

{
  byte bVar1;
  int *piVar2;
  void *pvVar3;
  undefined8 *puVar4;
  long *plVar5;
  connectdata *conn;
  curl_blob *pcVar6;
  ulong uVar7;
  _Bool _Var8;
  curl_socket_t cVar9;
  int iVar10;
  CURLcode CVar11;
  uint uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  timediff_t tVar15;
  uint *puVar16;
  ssl_config_data *psVar17;
  long lVar18;
  char *pcVar19;
  char *pcVar20;
  SSL_CIPHER *c;
  char *pcVar21;
  char *pcVar22;
  ulong uVar23;
  int *piVar24;
  SSL_SESSION **ppSVar25;
  ssl_primary_config *psVar26;
  BIO_METHOD *pBVar27;
  BIO *pBVar28;
  long lVar29;
  X509_NAME *pXVar30;
  ASN1_TIME *pAVar31;
  SSL_METHOD *meth;
  SSL_CTX *pSVar32;
  stack_st_X509 *psVar33;
  undefined8 uVar34;
  X509_PUBKEY *pXVar35;
  uchar *puVar36;
  OCSP_BASICRESP *bs;
  X509_STORE *st;
  X509 *pXVar37;
  X509 *issuer;
  EVP_MD *dgst;
  OCSP_CERTID *id;
  SSL *pSVar38;
  byte bVar39;
  curl_socket_t writefd;
  size_t size;
  size_t size_00;
  bool bVar40;
  char cVar41;
  CURLcode CVar42;
  int iVar43;
  curl_socket_t readfd0;
  uchar **ppuVar44;
  uint uVar45;
  bool bVar46;
  bool bVar47;
  int cert_status;
  int crl_reason;
  char *ptr;
  ASN1_OBJECT *paobj_cert;
  ASN1_GENERALIZEDTIME *thisupd;
  uchar *status;
  uchar *p;
  ASN1_GENERALIZEDTIME *rev;
  void *ssl_sessionid;
  char error_buffer [256];
  curl_blob *in_stack_fffffffffffff528;
  OCSP_RESPONSE *local_a80;
  int local_a74;
  ssl_primary_config *local_a70;
  char *local_a68;
  int local_a5c;
  void *local_a58;
  char *local_a50;
  ASN1_OBJECT *local_a48;
  ASN1_GENERALIZEDTIME *local_a40;
  ssl_primary_config *local_a38;
  _Bool *local_a30;
  uchar *local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  uchar *local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  ASN1_GENERALIZEDTIME *local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  SSL_SESSION *local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  uchar *local_838;
  char acStack_830 [8];
  char local_828 [8];
  char acStack_820 [8];
  undefined4 local_818;
  int local_814;
  
  piVar2 = (int *)cf->ctx;
  cVar9 = Curl_conn_cf_get_socket(cf,data);
  if (*piVar2 == 2) {
    *done = true;
    return CURLE_OK;
  }
  CVar11 = CURLE_OK;
  local_a30 = done;
  if (piVar2[1] == 0) {
    CVar11 = CURLE_OK;
    cVar41 = '\x01';
    tVar15 = Curl_timeleft(data,(curltime *)0x0,true);
    if (tVar15 < 0) {
      Curl_failf(data,"SSL connection timeout");
    }
    else {
      pvVar3 = cf->ctx;
      local_938 = (SSL_SESSION *)0x0;
      psVar26 = Curl_ssl_cf_get_primary_config(cf);
      psVar17 = Curl_ssl_cf_get_config(cf,data);
      uVar12 = (uint)psVar26->version;
      pcVar19 = (psVar17->primary).clientcert;
      local_a70 = (ssl_primary_config *)(psVar17->primary).cert_blob;
      local_a68 = psVar17->cert_type;
      bVar1 = psVar26->field_0x69;
      plVar5 = *(long **)((long)pvVar3 + 0x30);
      CVar11 = ossl_seed(data);
      if (CVar11 != CURLE_OK) goto LAB_006bd225;
      psVar17->certverifyresult = 1;
      local_a58 = pvVar3;
      local_a38 = psVar26;
      if (uVar12 < 8) {
        if ((0xf3U >> (uVar12 & 0x1f) & 1) == 0) {
          if (uVar12 == 2) {
            pcVar19 = "No SSLv2 support";
          }
          else {
            pcVar19 = "No SSLv3 support";
          }
          Curl_failf(data,pcVar19);
LAB_006bd827:
          CVar11 = CURLE_NOT_BUILT_IN;
          goto LAB_006bd225;
        }
        meth = (SSL_METHOD *)TLS_client_method();
        if (*plVar5 != 0) {
          ossl_close(cf,data);
        }
        pSVar32 = SSL_CTX_new(meth);
        *plVar5 = (long)pSVar32;
        if (pSVar32 == (SSL_CTX *)0x0) {
          uVar23 = ERR_peek_error();
          pcVar19 = ossl_strerror(uVar23,(char *)&local_838,0x100);
          Curl_failf(data,"SSL: couldn\'t create a context: %s",pcVar19);
LAB_006bd703:
          CVar11 = CURLE_OUT_OF_MEMORY;
        }
        else {
          SSL_CTX_ctrl(pSVar32,0x21,0x10,(void *)0x0);
          if (((data->set).fdebug != (curl_debug_callback)0x0) &&
             (((data->set).field_0x8bd & 0x10) != 0)) {
            SSL_CTX_set_msg_callback((SSL_CTX *)*plVar5,ossl_trace);
            SSL_CTX_ctrl((SSL_CTX *)*plVar5,0x10,0,cf);
          }
          uVar34 = 0x82024850;
          if ((psVar17->field_0xb0 & 4) == 0) {
            uVar34 = 0x82024050;
          }
          if (7 < uVar12) {
            pcVar19 = "Unrecognized parameter passed via CURLOPT_SSLVERSION";
            goto LAB_006bdb82;
          }
          if ((0xf3U >> (uVar12 & 0x1f) & 1) == 0) goto LAB_006bd827;
          pSVar32 = (SSL_CTX *)*plVar5;
          psVar26 = Curl_ssl_cf_get_primary_config(cf);
          bVar39 = psVar26->version - 1;
          if (bVar39 < 7) {
            lVar18 = *(long *)(&DAT_0090ea78 + (ulong)bVar39 * 8);
          }
          else {
            lVar18 = 0;
          }
          if ((psVar26->version == '\0') ||
             (lVar18 = SSL_CTX_ctrl(pSVar32,0x7b,lVar18,(void *)0x0), lVar18 != 0)) {
            uVar23 = (ulong)psVar26->version_max << 0x30;
            uVar7 = (ulong)(psVar26->version_max >> 0x10);
            lVar18 = (uVar23 | uVar7) + 0x2fd;
            if ((uVar23 | uVar7 & 0xffff00000000fffc) != 4) {
              lVar18 = 0;
            }
            lVar18 = SSL_CTX_ctrl(pSVar32,0x7c,lVar18,(void *)0x0);
            CVar11 = CURLE_SSL_CONNECT_ERROR;
            if (lVar18 != 0) {
              CVar11 = CURLE_OK;
            }
          }
          else {
            CVar11 = CURLE_SSL_CONNECT_ERROR;
          }
          if (CVar11 != CURLE_OK) goto LAB_006bd225;
          SSL_CTX_set_options(*plVar5,uVar34);
          pvVar3 = local_a58;
          if (*(alpn_spec **)((long)local_a58 + 0x28) != (alpn_spec *)0x0) {
            CVar11 = Curl_alpn_to_proto_buf
                               ((alpn_proto_buf *)&local_838,*(alpn_spec **)((long)local_a58 + 0x28)
                               );
            if ((CVar11 != CURLE_OK) ||
               (iVar10 = SSL_CTX_set_alpn_protos(*plVar5,&local_838,local_814), iVar10 != 0)) {
              pcVar19 = "Error setting ALPN";
              goto LAB_006bdb82;
            }
            Curl_alpn_to_proto_str
                      ((alpn_proto_buf *)&local_838,*(alpn_spec **)((long)pvVar3 + 0x28));
            if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
              Curl_infof(data,"ALPN: curl offers %s",&local_838);
            }
          }
          if ((pcVar19 != (char *)0x0 || local_a70 != (ssl_primary_config *)0x0) ||
              local_a68 != (char *)0x0) {
            in_stack_fffffffffffff528 = psVar17->key_blob;
            iVar10 = cert_stuff(data,(SSL_CTX *)*plVar5,pcVar19,(curl_blob *)local_a70,local_a68,
                                psVar17->key,in_stack_fffffffffffff528,psVar17->key_type,
                                psVar17->key_passwd);
            CVar11 = CURLE_SSL_CERTPROBLEM;
            if (iVar10 != 0) {
              CVar11 = CURLE_OK;
            }
            if (CVar11 != CURLE_OK) goto LAB_006bd225;
          }
          psVar26 = local_a38;
          pcVar19 = local_a38->cipher_list;
          if (pcVar19 != (char *)0x0) {
            iVar10 = SSL_CTX_set_cipher_list((SSL_CTX *)*plVar5,pcVar19);
            if (iVar10 == 0) {
              Curl_failf(data,"failed setting cipher list: %s",pcVar19);
              CVar11 = CURLE_SSL_CIPHER;
              goto LAB_006bd225;
            }
            if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
              Curl_infof(data,"Cipher selection: %s",pcVar19);
            }
          }
          pcVar19 = psVar26->cipher_list13;
          CVar11 = CURLE_SSL_CONNECT_ERROR;
          bVar47 = true;
          if (pcVar19 != (char *)0x0) {
            iVar10 = SSL_CTX_set_ciphersuites(*plVar5);
            if (iVar10 == 0) {
              bVar47 = false;
              Curl_failf(data,"failed setting TLS 1.3 cipher suite: %s",pcVar19);
              CVar11 = CURLE_SSL_CIPHER;
            }
            else if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
              Curl_infof(data,"TLS 1.3 cipher selection: %s",pcVar19);
            }
          }
          psVar26 = local_a38;
          if (bVar47) {
            SSL_CTX_set_post_handshake_auth(*plVar5);
            pcVar19 = psVar26->curves;
            bVar47 = true;
            if ((pcVar19 != (char *)0x0) &&
               (lVar18 = SSL_CTX_ctrl((SSL_CTX *)*plVar5,0x5c,0,pcVar19), lVar18 == 0)) {
              bVar47 = false;
              Curl_failf(data,"failed setting curves list: \'%s\'",pcVar19);
              CVar11 = CURLE_SSL_CIPHER;
            }
            if (bVar47) {
              SSL_CTX_set_verify((SSL_CTX *)*plVar5,bVar1 & 1,(callback *)0x0);
              _Var8 = Curl_tls_keylog_enabled();
              if (_Var8) {
                SSL_CTX_set_keylog_callback(*plVar5,ossl_keylog_callback);
              }
              SSL_CTX_ctrl((SSL_CTX *)*plVar5,0x2c,0x301,(void *)0x0);
              SSL_CTX_sess_set_new_cb((SSL_CTX *)*plVar5,ossl_new_session_cb);
              if ((data->set).ssl.fsslctx != (curl_ssl_ctx_callback)0x0) {
                if (*(char *)((long)plVar5 + 0x24) == '\0') {
                  CVar11 = Curl_ssl_setup_x509_store(cf,data,(SSL_CTX *)*plVar5);
                  if (CVar11 != CURLE_OK) goto LAB_006bd225;
                  *(undefined1 *)((long)plVar5 + 0x24) = 1;
                }
                Curl_set_in_callback(data,true);
                CVar11 = (*(data->set).ssl.fsslctx)(data,(void *)*plVar5,(data->set).ssl.fsslctxp);
                Curl_set_in_callback(data,false);
                if (CVar11 != CURLE_OK) {
                  Curl_failf(data,"error signaled by ssl ctx callback");
                  goto LAB_006bd225;
                }
              }
              if ((SSL *)plVar5[1] != (SSL *)0x0) {
                SSL_free((SSL *)plVar5[1]);
              }
              pSVar38 = SSL_new((SSL_CTX *)*plVar5);
              plVar5[1] = (long)pSVar38;
              if (pSVar38 == (SSL *)0x0) {
                Curl_failf(data,"SSL: couldn\'t create a context (handle)");
                goto LAB_006bd703;
              }
              SSL_set_ex_data(pSVar38,0,cf);
              if ((local_a38->field_0x69 & 4) != 0) {
                SSL_ctrl((SSL *)plVar5[1],0x41,1,(void *)0x0);
              }
              SSL_set_connect_state((SSL *)plVar5[1]);
              pvVar3 = local_a58;
              plVar5[2] = 0;
              if ((*(void **)((long)local_a58 + 0x18) != (void *)0x0) &&
                 (lVar18 = SSL_ctrl((SSL *)plVar5[1],0x37,0,*(void **)((long)local_a58 + 0x18)),
                 lVar18 == 0)) {
                pcVar19 = "Failed set SNI";
                goto LAB_006bdb82;
              }
              SSL_set_ex_data((SSL *)plVar5[1],0,cf);
              *(byte *)((long)pvVar3 + 0x54) = *(byte *)((long)pvVar3 + 0x54) & 0xfd;
              if (((psVar17->primary).field_0x69 & 8) != 0) {
                Curl_ssl_sessionid_lock(data);
                _Var8 = Curl_ssl_getsessionid(cf,data,&local_938,(size_t *)0x0);
                if (!_Var8) {
                  iVar10 = SSL_set_session((SSL *)plVar5[1],local_938);
                  if (iVar10 == 0) {
                    Curl_ssl_sessionid_unlock(data);
                    uVar23 = ERR_get_error();
                    pcVar19 = ossl_strerror(uVar23,(char *)&local_838,0x100);
                    Curl_failf(data,"SSL: SSL_set_session failed: %s",pcVar19);
                    goto LAB_006bdb89;
                  }
                  if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
                    Curl_infof(data,"SSL reusing session ID");
                  }
                  *(byte *)((long)local_a58 + 0x54) = *(byte *)((long)local_a58 + 0x54) | 2;
                }
                Curl_ssl_sessionid_unlock(data);
              }
              pBVar27 = (BIO_METHOD *)ossl_bio_cf_method_create();
              plVar5[3] = (long)pBVar27;
              CVar11 = CURLE_OUT_OF_MEMORY;
              if ((pBVar27 != (BIO_METHOD *)0x0) &&
                 (pBVar28 = BIO_new(pBVar27), pBVar28 != (BIO *)0x0)) {
                BIO_set_data(pBVar28,cf);
                SSL_set_bio((SSL *)plVar5[1],pBVar28,pBVar28);
                *(undefined4 *)((long)local_a58 + 4) = 1;
                CVar11 = CURLE_OK;
              }
            }
          }
        }
      }
      else {
        pcVar19 = "Unrecognized parameter passed via CURLOPT_SSLVERSION";
LAB_006bdb82:
        Curl_failf(data,pcVar19);
LAB_006bdb89:
        CVar11 = CURLE_SSL_CONNECT_ERROR;
      }
LAB_006bd225:
      cVar41 = (CVar11 != CURLE_OK) * '\x02';
    }
    if (cVar41 == '\x02') {
      return CVar11;
    }
    if (cVar41 != '\0') {
      return CURLE_OPERATION_TIMEDOUT;
    }
  }
  while (piVar2[1] - 1U < 3) {
    tVar15 = Curl_timeleft(data,(curltime *)0x0,true);
    if (tVar15 < 0) {
      Curl_failf(data,"SSL connection timeout");
      CVar11 = CURLE_OPERATION_TIMEDOUT;
      bVar47 = true;
    }
    else {
      if ((!nonblocking) && (uVar12 = piVar2[1], (uVar12 & 0xfffffffe) == 2)) {
        writefd = -1;
        if (uVar12 == 3) {
          writefd = cVar9;
        }
        readfd0 = -1;
        if (uVar12 == 2) {
          readfd0 = cVar9;
        }
        iVar10 = Curl_socket_check(readfd0,-1,writefd,tVar15);
        if (iVar10 < 0) {
          puVar16 = (uint *)__errno_location();
          Curl_failf(data,"select/poll on SSL socket, errno: %d",(ulong)*puVar16);
          CVar11 = CURLE_SSL_CONNECT_ERROR;
LAB_006bcd83:
          bVar46 = false;
          bVar47 = true;
        }
        else {
          if (iVar10 == 0) {
            Curl_failf(data,"SSL connection timeout");
            CVar11 = CURLE_OPERATION_TIMEDOUT;
            goto LAB_006bcd83;
          }
          bVar47 = false;
          bVar46 = true;
        }
        if (!bVar46) goto LAB_006bd038;
      }
      pvVar3 = cf->ctx;
      puVar4 = *(undefined8 **)((long)pvVar3 + 0x30);
      psVar17 = Curl_ssl_cf_get_config(cf,data);
      ERR_clear_error();
      iVar10 = SSL_connect((SSL *)puVar4[1]);
      if (*(char *)((long)puVar4 + 0x24) == '\0') {
        CVar11 = Curl_ssl_setup_x509_store(cf,data,(SSL_CTX *)*puVar4);
        if (CVar11 == CURLE_OK) {
          *(undefined1 *)((long)puVar4 + 0x24) = 1;
          goto LAB_006bcdea;
        }
      }
      else {
LAB_006bcdea:
        if (iVar10 == 1) {
          local_938 = (SSL_SESSION *)((ulong)local_938 & 0xffffffff00000000);
          *(undefined4 *)((long)pvVar3 + 4) = 4;
          SSL_get_peer_signature_type_nid(puVar4[1],&local_938);
          lVar18 = SSL_ctrl((SSL *)puVar4[1],0x86,0,(void *)0x0);
          pcVar19 = OBJ_nid2sn((uint)lVar18 & 0xffff);
          if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
            pcVar20 = SSL_get_version((SSL *)puVar4[1]);
            c = SSL_get_current_cipher((SSL *)puVar4[1]);
            pcVar21 = SSL_CIPHER_get_name(c);
            if (pcVar19 == (char *)0x0) {
              pcVar19 = "[blank]";
            }
            pcVar22 = OBJ_nid2sn((int)local_938);
            Curl_infof(data,"SSL connection using %s / %s / %s / %s",pcVar20,pcVar21,pcVar19,pcVar22
                      );
          }
          if (*(long *)((long)pvVar3 + 0x28) != 0) {
            SSL_get0_alpn_selected(puVar4[1],&local_838,&local_a28);
            CVar11 = Curl_alpn_set_negotiated(cf,data,local_838,(ulong)local_a28 & 0xffffffff);
            goto LAB_006bd001;
          }
        }
        else {
          iVar10 = SSL_get_error((SSL *)puVar4[1],iVar10);
          if (iVar10 < 9) {
            if (iVar10 == 2) {
              *(undefined4 *)((long)pvVar3 + 4) = 2;
            }
            else {
              if (iVar10 != 3) goto LAB_006bcf36;
              *(undefined4 *)((long)pvVar3 + 4) = 3;
            }
          }
          else {
            if ((iVar10 != 9) && (iVar10 != 0xc)) {
LAB_006bcf36:
              CVar11 = CURLE_OK;
              if (*(int *)(puVar4 + 4) != 0x51) {
                memset(&local_838,0,0x100);
                *(undefined4 *)((long)pvVar3 + 4) = 1;
                uVar23 = ERR_get_error();
                uVar45 = (uint)uVar23;
                bVar47 = (int)uVar45 < 0;
                uVar12 = 0x7fffffff;
                if (!bVar47) {
                  uVar12 = 0x7fffff;
                }
                uVar12 = uVar12 & uVar45;
                bVar46 = (uVar45 & 0xff800000) != 0xa000000;
                if ((bVar46 || bVar47) || ((uVar12 != 0x415 && (uVar12 != 0x86)))) {
                  ossl_strerror(uVar23,(char *)&local_838,0x100);
                  bVar40 = (bVar46 || bVar47) || uVar12 != 0x45c;
                  CVar11 = CURLE_SSL_CONNECT_ERROR;
                  if ((!bVar46 && !bVar47) && uVar12 == 0x45c) {
                    CVar11 = CURLE_SSL_CLIENTCERT;
                  }
                }
                else {
                  lVar18 = SSL_get_verify_result((SSL *)puVar4[1]);
                  if (lVar18 == 0) {
                    local_828[0] = 'v';
                    local_828[1] = 'e';
                    local_828[2] = 'r';
                    local_828[3] = 'i';
                    local_828[4] = 'f';
                    local_828[5] = 'i';
                    local_828[6] = 'c';
                    local_828[7] = 'a';
                    acStack_820[0] = 't';
                    acStack_820[1] = 'i';
                    acStack_820[2] = 'o';
                    acStack_820[3] = 'n';
                    acStack_820[4] = ' ';
                    acStack_820[5] = 'f';
                    acStack_820[6] = 'a';
                    acStack_820[7] = 'i';
                    local_838 = (uchar *)0x74726563204c5353;
                    acStack_830[0] = 'i';
                    acStack_830[1] = 'f';
                    acStack_830[2] = 'i';
                    acStack_830[3] = 'c';
                    acStack_830[4] = 'a';
                    acStack_830[5] = 't';
                    acStack_830[6] = 'e';
                    acStack_830[7] = ' ';
                    local_818._0_1_ = 'l';
                    local_818._1_3_ = 0x6465;
                    CVar11 = CURLE_PEER_FAILED_VERIFICATION;
                    bVar40 = false;
                  }
                  else {
                    psVar17->certverifyresult = lVar18;
                    pcVar19 = X509_verify_cert_error_string(lVar18);
                    bVar40 = false;
                    curl_msnprintf((char *)&local_838,0x100,"SSL certificate problem: %s",pcVar19);
                    CVar11 = CURLE_PEER_FAILED_VERIFICATION;
                  }
                }
                if ((uVar23 == 0) && (bVar40)) {
                  local_8f8 = 0;
                  uStack_8f0 = 0;
                  local_908 = 0;
                  uStack_900 = 0;
                  local_918 = 0;
                  uStack_910 = 0;
                  local_928 = 0;
                  uStack_920 = 0;
                  local_938 = (SSL_SESSION *)0x0;
                  uStack_930 = 0;
                  piVar24 = __errno_location();
                  if (iVar10 == 5 && *piVar24 != 0) {
                    Curl_strerror(*piVar24,(char *)&local_938,0x50);
                  }
                  ppSVar25 = &local_938;
                  if ((char)local_938 == '\0') {
                    ppSVar25 = (SSL_SESSION **)SSL_ERROR_to_str(iVar10);
                  }
                  Curl_failf(data,"OpenSSL SSL_connect: %s in connection to %s:%d ",ppSVar25,
                             *(undefined8 *)((long)pvVar3 + 8),(ulong)*(uint *)((long)pvVar3 + 0x50)
                            );
                }
                else {
                  Curl_failf(data,"%s",&local_838);
                }
              }
              goto LAB_006bd001;
            }
            *(undefined4 *)((long)pvVar3 + 4) = 1;
          }
        }
        CVar11 = CURLE_OK;
      }
LAB_006bd001:
      bVar47 = true;
      if ((CVar11 == CURLE_OK) && ((!nonblocking || (2 < piVar2[1] - 1U)))) {
        bVar47 = false;
        CVar11 = CURLE_OK;
      }
    }
LAB_006bd038:
    if (bVar47) {
      if (bVar47) {
        return CVar11;
      }
      return CURLE_OPERATION_TIMEDOUT;
    }
  }
  if (piVar2[1] != 4) goto LAB_006be02c;
  local_a68 = (char *)cf->ctx;
  psVar26 = Curl_ssl_cf_get_primary_config(cf);
  bVar1 = psVar26->field_0x69;
  pvVar3 = cf->ctx;
  conn = cf->conn;
  psVar17 = Curl_ssl_cf_get_config(cf,data);
  local_a70 = Curl_ssl_cf_get_primary_config(cf);
  memset(&local_938,0,0x100);
  pBVar27 = BIO_s_mem();
  pBVar28 = BIO_new(pBVar27);
  if (pBVar28 == (BIO *)0x0) {
    uVar23 = ERR_get_error();
    pcVar19 = ossl_strerror(uVar23,(char *)&local_938,0x100);
    Curl_failf(data,"BIO_new return NULL, OpenSSL error %s",pcVar19);
LAB_006bd62b:
    CVar11 = CURLE_OUT_OF_MEMORY;
  }
  else {
    lVar18 = *(long *)((long)pvVar3 + 0x30);
    if (((data->set).ssl.field_0xb0 & 1) != 0) {
      Curl_ossl_certchain(data,*(SSL **)(lVar18 + 8));
    }
    lVar29 = SSL_get1_peer_certificate(*(undefined8 *)(lVar18 + 8));
    *(long *)(lVar18 + 0x10) = lVar29;
    if (lVar29 == 0) {
      BIO_free(pBVar28);
      if ((bVar1 & 3) == 0) {
        CVar11 = CURLE_OK;
      }
      else {
        Curl_failf(data,"SSL: couldn\'t get peer certificate");
        CVar11 = CURLE_PEER_FAILED_VERIFICATION;
      }
    }
    else {
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
        _Var8 = Curl_ssl_cf_is_proxy(cf);
        pcVar19 = "Server";
        if (_Var8) {
          pcVar19 = "Proxy";
        }
        Curl_infof(data,"%s certificate:",pcVar19);
      }
      pXVar30 = X509_get_subject_name(*(X509 **)(lVar18 + 0x10));
      iVar10 = x509_name_oneline((X509_NAME *)pXVar30,(char *)&local_838,size);
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
        ppuVar44 = (uchar **)"[NONE]";
        if (iVar10 == 0) {
          ppuVar44 = &local_838;
        }
        Curl_infof(data," subject: %s",ppuVar44);
      }
      pAVar31 = (ASN1_TIME *)X509_get0_notBefore(*(undefined8 *)(lVar18 + 0x10));
      ASN1_TIME_print(pBVar28,pAVar31);
      uVar23 = BIO_ctrl(pBVar28,3,0,&local_a50);
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
        Curl_infof(data," start date: %.*s",uVar23 & 0xffffffff);
      }
      BIO_ctrl(pBVar28,1,0,(void *)0x0);
      pAVar31 = (ASN1_TIME *)X509_get0_notAfter(*(undefined8 *)(lVar18 + 0x10));
      ASN1_TIME_print(pBVar28,pAVar31);
      uVar23 = BIO_ctrl(pBVar28,3,0,&local_a50);
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
        Curl_infof(data," expire date: %.*s",uVar23 & 0xffffffff);
      }
      BIO_ctrl(pBVar28,1,0,(void *)0x0);
      BIO_free(pBVar28);
      psVar26 = local_a70;
      if (((local_a70->field_0x69 & 2) == 0) ||
         (CVar11 = Curl_ossl_verifyhost
                             (data,conn,(ssl_peer *)((long)pvVar3 + 8),*(X509 **)(lVar18 + 0x10)),
         CVar11 == CURLE_OK)) {
        pXVar30 = X509_get_issuer_name(*(X509 **)(lVar18 + 0x10));
        iVar10 = x509_name_oneline((X509_NAME *)pXVar30,(char *)&local_838,size_00);
        if (iVar10 == 0) {
          if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
            Curl_infof(data," issuer: %s",&local_838);
          }
          if ((psVar26->issuercert != (char *)0x0) || (psVar26->issuercert_blob != (curl_blob *)0x0)
             ) {
            pcVar6 = psVar26->issuercert_blob;
            if (pcVar6 == (curl_blob *)0x0) {
              pBVar27 = BIO_s_file();
              pBVar28 = BIO_new(pBVar27);
              if (pBVar28 != (BIO *)0x0) {
                lVar29 = BIO_ctrl(pBVar28,0x6c,3,psVar26->issuercert);
                if (0 < (int)lVar29) goto LAB_006bdcf0;
                if ((bVar1 & 3) != 0) {
                  Curl_failf(data,"SSL: Unable to open issuer cert (%s)",psVar26->issuercert);
                }
                BIO_free(pBVar28);
                goto LAB_006bdd7e;
              }
              uVar23 = ERR_get_error();
              pcVar19 = ossl_strerror(uVar23,(char *)&local_938,0x100);
              pcVar20 = "BIO_new return NULL, OpenSSL error %s";
LAB_006bddbb:
              Curl_failf(data,pcVar20,pcVar19);
              X509_free(*(X509 **)(lVar18 + 0x10));
              *(undefined8 *)(lVar18 + 0x10) = 0;
              goto LAB_006bd62b;
            }
            pBVar28 = BIO_new_mem_buf(pcVar6->data,(int)pcVar6->len);
            if (pBVar28 == (BIO *)0x0) {
              uVar23 = ERR_get_error();
              pcVar19 = ossl_strerror(uVar23,(char *)&local_938,0x100);
              pcVar20 = "BIO_new_mem_buf NULL, OpenSSL error %s";
              goto LAB_006bddbb;
            }
LAB_006bdcf0:
            pXVar37 = PEM_read_bio_X509(pBVar28,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
            if (pXVar37 == (X509 *)0x0) {
              if ((bVar1 & 3) != 0) {
                Curl_failf(data,"SSL: Unable to read issuer cert (%s)",psVar26->issuercert);
              }
              BIO_free(pBVar28);
              pXVar37 = (X509 *)0x0;
            }
            else {
              iVar10 = X509_check_issued(pXVar37,*(X509 **)(lVar18 + 0x10));
              if (iVar10 == 0) {
                if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
                  Curl_infof(data," SSL certificate issuer check ok (%s)",psVar26->issuercert);
                }
                BIO_free(pBVar28);
                X509_free(pXVar37);
                goto LAB_006be09c;
              }
              if ((bVar1 & 3) != 0) {
                Curl_failf(data,"SSL: Certificate issuer check failed (%s)",psVar26->issuercert);
              }
              BIO_free(pBVar28);
            }
            X509_free(pXVar37);
LAB_006bdd7e:
            X509_free(*(X509 **)(lVar18 + 0x10));
            *(undefined8 *)(lVar18 + 0x10) = 0;
            CVar11 = CURLE_SSL_ISSUER_ERROR;
            goto LAB_006be018;
          }
LAB_006be09c:
          lVar29 = SSL_get_verify_result(*(SSL **)(lVar18 + 8));
          psVar17->certverifyresult = lVar29;
          if (lVar29 == 0) {
            CVar42 = CURLE_OK;
            if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
              CVar42 = CURLE_OK;
              Curl_infof(data," SSL certificate verify ok.");
            }
          }
          else if ((psVar26->field_0x69 & 1) == 0) {
            CVar42 = CURLE_OK;
            if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
              pcVar19 = X509_verify_cert_error_string(lVar29);
              CVar42 = CURLE_OK;
              Curl_infof(data," SSL certificate verify result: %s (%ld), continuing anyway.",pcVar19
                         ,lVar29);
            }
          }
          else {
            CVar42 = CURLE_PEER_FAILED_VERIFICATION;
            if ((bVar1 & 3) != 0) {
              pcVar19 = X509_verify_cert_error_string(lVar29);
              Curl_failf(data,"SSL certificate verify result: %s (%ld)",pcVar19,lVar29);
            }
          }
        }
        else {
          CVar42 = CURLE_PEER_FAILED_VERIFICATION;
          if ((bVar1 & 3) != 0) {
            Curl_failf(data,"SSL: couldn\'t get X509-issuer name");
          }
        }
        pSVar38 = *(SSL **)(lVar18 + 8);
        lVar29 = SSL_get_verify_result(pSVar38);
        if (lVar29 == 0) {
          psVar33 = (stack_st_X509 *)SSL_get0_verified_chain();
        }
        else {
          psVar33 = SSL_get_peer_cert_chain(pSVar38);
        }
        uVar12 = OPENSSL_sk_num(psVar33);
        if (0 < (int)uVar12) {
          uVar23 = 0;
          do {
            local_9e8 = 0;
            uStack_9e0 = 0;
            local_9f8 = 0;
            uStack_9f0 = 0;
            local_a08 = 0;
            uStack_a00 = 0;
            local_a18 = 0;
            uStack_a10 = 0;
            local_a28 = (uchar *)0x0;
            uStack_a20 = 0;
            local_998 = 0;
            uStack_990 = 0;
            local_9a8 = 0;
            uStack_9a0 = 0;
            local_9b8 = 0;
            uStack_9b0 = 0;
            local_9c8 = 0;
            uStack_9c0 = 0;
            local_9d8 = (uchar *)0x0;
            uStack_9d0 = 0;
            local_a40 = (ASN1_GENERALIZEDTIME *)0x0;
            local_a48 = (ASN1_OBJECT *)0x0;
            uVar34 = OPENSSL_sk_value(psVar33,uVar23);
            X509_get0_signature(0,&local_a40,uVar34);
            X509_ALGOR_get0(&local_a48,(int *)0x0,(void **)0x0,(X509_ALGOR *)local_a40);
            OBJ_obj2txt((char *)&local_a28,0x50,local_a48,0);
            uVar34 = X509_get0_pubkey(uVar34);
            uVar13 = EVP_PKEY_get_bits(uVar34);
            uVar14 = EVP_PKEY_get_security_bits(uVar34);
            local_948 = 0;
            uStack_940 = 0;
            local_958 = 0;
            uStack_950 = 0;
            local_968 = 0;
            uStack_960 = 0;
            local_978 = 0;
            uStack_970 = 0;
            local_988 = (ASN1_GENERALIZEDTIME *)0x0;
            uStack_980 = 0;
            iVar10 = EVP_PKEY_get_group_name(uVar34,&local_988,0x50,0);
            curl_msnprintf((char *)&local_9d8,0x50,"/%s",&local_988);
            pcVar19 = (char *)EVP_PKEY_get0_type_name(uVar34);
            if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
              if (pcVar19 == (char *)0x0) {
                pcVar19 = "?";
              }
              ppuVar44 = &local_9d8;
              if (iVar10 == 0) {
                ppuVar44 = (uchar **)0x923ff5;
              }
              in_stack_fffffffffffff528 =
                   (curl_blob *)CONCAT44((int)((ulong)in_stack_fffffffffffff528 >> 0x20),uVar14);
              Curl_infof(data,
                         "  Certificate level %d: Public key type %s%s (%d/%d Bits/secBits), signed using %s"
                         ,uVar23,pcVar19,ppuVar44,uVar13,in_stack_fffffffffffff528,&local_a28);
            }
            uVar45 = (int)uVar23 + 1;
            uVar23 = (ulong)uVar45;
          } while (uVar12 != uVar45);
        }
        if (((local_a70->field_0x69 & 4) != 0) && ((*(byte *)((long)pvVar3 + 0x54) & 2) == 0)) {
          puVar4 = *(undefined8 **)((long)cf->ctx + 0x30);
          lVar29 = SSL_ctrl((SSL *)puVar4[1],0x46,0,&local_a28);
          if (local_a28 == (uchar *)0x0) {
            pcVar19 = "No OCSP response received";
LAB_006bdde7:
            bs = (OCSP_BASICRESP *)0x0;
            Curl_failf(data,pcVar19);
            CVar11 = CURLE_SSL_INVALIDCERTSTATUS;
            local_a80 = (OCSP_RESPONSE *)0x0;
            bVar47 = false;
          }
          else {
            local_9d8 = local_a28;
            local_a80 = d2i_OCSP_RESPONSE((OCSP_RESPONSE **)0x0,&local_9d8,lVar29);
            if (local_a80 == (OCSP_RESPONSE *)0x0) {
              pcVar19 = "Invalid OCSP response";
              goto LAB_006bdde7;
            }
            iVar10 = OCSP_response_status(local_a80);
            if (iVar10 == 0) {
              bs = OCSP_response_get1_basic(local_a80);
              if (bs == (OCSP_BASICRESP *)0x0) {
                Curl_failf(data,"Invalid OCSP response");
                goto LAB_006bdaf8;
              }
              psVar33 = SSL_get_peer_cert_chain((SSL *)puVar4[1]);
              if (psVar33 == (stack_st_X509 *)0x0) {
                pcVar19 = "Could not get peer certificate chain";
LAB_006be4fc:
                bVar47 = false;
                Curl_failf(data,pcVar19);
                CVar11 = CURLE_SSL_INVALIDCERTSTATUS;
              }
              else {
                st = SSL_CTX_get_cert_store((SSL_CTX *)*puVar4);
                iVar10 = OCSP_basic_verify(bs,psVar33,st,0);
                if (iVar10 < 1) {
                  pcVar19 = "OCSP response verification failed";
                  goto LAB_006be4fc;
                }
                pXVar37 = (X509 *)SSL_get1_peer_certificate(puVar4[1]);
                if (pXVar37 == (X509 *)0x0) {
                  pcVar19 = "Error getting peer certificate";
LAB_006be793:
                  Curl_failf(data,pcVar19);
LAB_006be7a5:
                  bVar47 = false;
                  CVar11 = CURLE_SSL_INVALIDCERTSTATUS;
                }
                else {
                  iVar10 = OPENSSL_sk_num(psVar33);
                  iVar43 = 0;
                  id = (OCSP_CERTID *)0x0;
                  if (0 < iVar10) {
                    do {
                      issuer = (X509 *)OPENSSL_sk_value(psVar33,iVar43);
                      iVar10 = X509_check_issued(issuer,pXVar37);
                      if (iVar10 == 0) {
                        dgst = EVP_sha1();
                        id = OCSP_cert_to_id(dgst,pXVar37,issuer);
                        break;
                      }
                      iVar43 = iVar43 + 1;
                      iVar10 = OPENSSL_sk_num(psVar33);
                    } while (iVar43 < iVar10);
                  }
                  X509_free(pXVar37);
                  if (id == (OCSP_CERTID *)0x0) {
                    pcVar19 = "Error computing OCSP ID";
                    goto LAB_006be793;
                  }
                  iVar10 = OCSP_resp_find_status
                                     (bs,id,&local_a74,&local_a5c,&local_988,&local_a40,
                                      (ASN1_GENERALIZEDTIME **)&local_a48);
                  OCSP_CERTID_free(id);
                  if (iVar10 != 1) {
                    pcVar19 = "Could not find certificate ID in OCSP response";
                    goto LAB_006be793;
                  }
                  iVar10 = OCSP_check_validity(local_a40,(ASN1_GENERALIZEDTIME *)local_a48,300,-1);
                  if (iVar10 == 0) {
                    pcVar19 = "OCSP response has expired";
                    goto LAB_006be793;
                  }
                  if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
                    pcVar19 = OCSP_cert_status_str((long)local_a74);
                    Curl_infof(data,"SSL certificate status: %s (%d)",pcVar19);
                  }
                  if (local_a74 != 0) {
                    if (local_a74 != 1) {
                      CVar11 = CURLE_SSL_INVALIDCERTSTATUS;
                      bVar47 = false;
                      goto LAB_006bde05;
                    }
                    pcVar19 = OCSP_crl_reason_str((long)local_a5c);
                    Curl_failf(data,"SSL certificate revocation reason: %s (%d)",pcVar19);
                    goto LAB_006be7a5;
                  }
                  bVar47 = true;
                  CVar11 = CURLE_OK;
                }
              }
            }
            else {
              pcVar19 = OCSP_response_status_str((long)iVar10);
              Curl_failf(data,"Invalid OCSP response status: %s (%d)",pcVar19);
LAB_006bdaf8:
              bs = (OCSP_BASICRESP *)0x0;
              CVar11 = CURLE_SSL_INVALIDCERTSTATUS;
              bVar47 = false;
            }
          }
LAB_006bde05:
          if (bs != (OCSP_BASICRESP *)0x0) {
            OCSP_BASICRESP_free(bs);
          }
          OCSP_RESPONSE_free(local_a80);
          CVar42 = CURLE_OK;
          if (!bVar47) {
            _Var8 = Curl_ssl_cf_is_proxy(cf);
            if (!_Var8) {
              local_a28 = (uchar *)0x0;
              Curl_ssl_sessionid_lock(data);
              _Var8 = Curl_ssl_getsessionid(cf,data,&local_a28,(size_t *)0x0);
              if (!_Var8) {
                if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
                  Curl_infof(data,"Remove session ID again from cache");
                }
                Curl_ssl_delsessionid(data,local_a28);
              }
              Curl_ssl_sessionid_unlock(data);
            }
            goto LAB_006bd487;
          }
        }
        CVar11 = CURLE_OK;
        if ((bVar1 & 3) != 0) {
          CVar11 = CVar42;
        }
        _Var8 = Curl_ssl_cf_is_proxy(cf);
        pcVar19 = (data->set).str[(ulong)_Var8 + 0x1e];
        local_a50 = pcVar19;
        if (pcVar19 != (char *)0x0 && CVar11 == CURLE_OK) {
          lVar29 = *(long *)(lVar18 + 0x10);
          local_a28 = (uchar *)0x0;
          if (lVar29 == 0) {
            CVar11 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
          }
          else {
            pXVar35 = (X509_PUBKEY *)X509_get_X509_PUBKEY(lVar29);
            uVar12 = i2d_X509_PUBKEY(pXVar35,(uchar **)0x0);
            CVar11 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
            puVar36 = (uchar *)0x0;
            if (0 < (int)uVar12) {
              uVar23 = (ulong)uVar12;
              puVar36 = (uchar *)(*Curl_cmalloc)(uVar23);
              local_a28 = puVar36;
              if (puVar36 == (uchar *)0x0) {
                puVar36 = (uchar *)0x0;
              }
              else {
                pXVar35 = (X509_PUBKEY *)X509_get_X509_PUBKEY(lVar29);
                uVar45 = i2d_X509_PUBKEY(pXVar35,&local_a28);
                if ((local_a28 != (uchar *)0x0 && uVar12 == uVar45) &&
                    (long)local_a28 - (long)puVar36 == uVar23) {
                  CVar11 = Curl_pin_peer_pubkey(data,pcVar19,puVar36,uVar23);
                }
              }
            }
            if (puVar36 != (uchar *)0x0) {
              (*Curl_cfree)(puVar36);
            }
          }
          if (CVar11 == CURLE_OK) {
            CVar11 = CURLE_OK;
          }
          else {
            Curl_failf(data,"SSL: public key does not match pinned public key");
          }
        }
        X509_free(*(X509 **)(lVar18 + 0x10));
        *(undefined8 *)(lVar18 + 0x10) = 0;
        *(undefined4 *)((long)pvVar3 + 4) = 5;
      }
      else {
LAB_006bd487:
        X509_free(*(X509 **)(lVar18 + 0x10));
        *(undefined8 *)(lVar18 + 0x10) = 0;
      }
    }
  }
LAB_006be018:
  if (CVar11 != CURLE_OK) {
    return CVar11;
  }
  *(undefined4 *)((long)local_a68 + 4) = 5;
  CVar11 = CURLE_OK;
LAB_006be02c:
  if (piVar2[1] == 5) {
    *piVar2 = 2;
  }
  *local_a30 = piVar2[1] == 5;
  piVar2[1] = 0;
  return CVar11;
}

Assistant:

static CURLcode ossl_connect_common(struct Curl_cfilter *cf,
                                    struct Curl_easy *data,
                                    bool nonblocking,
                                    bool *done)
{
  CURLcode result = CURLE_OK;
  struct ssl_connect_data *connssl = cf->ctx;
  curl_socket_t sockfd = Curl_conn_cf_get_socket(cf, data);
  int what;

  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(ssl_connect_1 == connssl->connecting_state) {
    /* Find out how much more time we're allowed */
    const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time is already up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    result = ossl_connect_step1(cf, data);
    if(result)
      goto out;
  }

  while(ssl_connect_2 == connssl->connecting_state ||
        ssl_connect_2_reading == connssl->connecting_state ||
        ssl_connect_2_writing == connssl->connecting_state) {

    /* check allowed time left */
    const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      result = CURLE_OPERATION_TIMEDOUT;
      goto out;
    }

    /* if ssl is expecting something, check if it's available. */
    if(!nonblocking &&
       (connssl->connecting_state == ssl_connect_2_reading ||
        connssl->connecting_state == ssl_connect_2_writing)) {

      curl_socket_t writefd = ssl_connect_2_writing ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;
      curl_socket_t readfd = ssl_connect_2_reading ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;

      what = Curl_socket_check(readfd, CURL_SOCKET_BAD, writefd,
                               timeout_ms);
      if(what < 0) {
        /* fatal error */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        result = CURLE_SSL_CONNECT_ERROR;
        goto out;
      }
      if(0 == what) {
        /* timeout */
        failf(data, "SSL connection timeout");
        result = CURLE_OPERATION_TIMEDOUT;
        goto out;
      }
      /* socket is readable or writable */
    }

    /* Run transaction, and return to the caller if it failed or if this
     * connection is done nonblocking and this loop would execute again. This
     * permits the owner of a multi handle to abort a connection attempt
     * before step2 has completed while ensuring that a client using select()
     * or epoll() will always have a valid fdset to wait on.
     */
    result = ossl_connect_step2(cf, data);
    if(result || (nonblocking &&
                  (ssl_connect_2 == connssl->connecting_state ||
                   ssl_connect_2_reading == connssl->connecting_state ||
                   ssl_connect_2_writing == connssl->connecting_state)))
      goto out;

  } /* repeat step2 until all transactions are done. */

  if(ssl_connect_3 == connssl->connecting_state) {
    result = ossl_connect_step3(cf, data);
    if(result)
      goto out;
  }

  if(ssl_connect_done == connssl->connecting_state) {
    connssl->state = ssl_connection_complete;
    *done = TRUE;
  }
  else
    *done = FALSE;

  /* Reset our connect state machine */
  connssl->connecting_state = ssl_connect_1;

out:
  return result;
}